

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMQ.cpp
# Opt level: O2

void __thiscall liblogger::LogMQ::LogMQ(LogMQ *this,string *qname)

{
  mqd_t mVar1;
  ostream *poVar2;
  LogException *this_00;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogMQ_00152688;
  std::__cxx11::string::string((string *)&this->m_QName,(string *)qname);
  mVar1 = mq_open((qname->_M_dataplus)._M_p,1,0x180,0);
  this->m_id = mVar1;
  if (-1 < mVar1) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_198,"failed to open queue \'");
  poVar2 = std::operator<<(poVar2,(string *)qname);
  std::operator<<(poVar2,"\'");
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(this_00,&sStack_1c8);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogMQ::LogMQ(const std::string &qname) :
	m_QName(qname)
{
	m_id = mq_open(qname.c_str(), O_WRONLY,  S_IRUSR | S_IWUSR, NULL);
	if (m_id < 0) {
		std::stringstream ss;
		ss << "failed to open queue '" << qname << "'";
		throw(LogException(ss.str()));
	}
}